

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

vec<unsigned_int> * __thiscall
Minisat::OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::lookup
          (OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *this,
          int *idx)

{
  long lVar1;
  
  lVar1 = (long)*idx;
  if ((this->dirty).data[lVar1] != '\0') {
    clean(this,idx);
    lVar1 = (long)*idx;
  }
  return (this->occs).data + lVar1;
}

Assistant:

Vec &lookup(const Idx &idx)
    {
        if (dirty[toInt(idx)]) clean(idx);
        return occs[toInt(idx)];
    }